

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O3

ValueInfo * __thiscall
ArrayValueInfo::Copy
          (ArrayValueInfo *this,JitArenaAllocator *allocator,bool copyHeadSegment,
          bool copyHeadSegmentLength,bool copyLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArrayValueInfo *pAVar4;
  ValueInfo *pVVar5;
  StackSym *headSegmentLengthSym;
  StackSym *headSegmentSym;
  StackSym *lengthSym;
  
  if (allocator == (JitArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                       ,0x289,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((this->headSegmentLengthSym == (StackSym *)0x0 || !copyHeadSegmentLength) &&
       (this->headSegmentSym == (StackSym *)0x0 || !copyHeadSegment)) &&
     ((!copyLength || (this->lengthSym == (StackSym *)0x0)))) {
    pVVar5 = ValueInfo::CopyWithGenericStructureKind(&this->super_ValueInfo,allocator);
    return pVVar5;
  }
  lengthSym = (StackSym *)0x0;
  headSegmentSym = this->headSegmentSym;
  if (!copyHeadSegment) {
    headSegmentSym = lengthSym;
  }
  headSegmentLengthSym = this->headSegmentLengthSym;
  if (!copyHeadSegmentLength) {
    headSegmentLengthSym = lengthSym;
  }
  if (copyLength) {
    lengthSym = this->lengthSym;
  }
  pAVar4 = New(allocator,(ValueType)SUB42(*(undefined4 *)&(this->super_ValueInfo).super_ValueType,0)
               ,headSegmentSym,headSegmentLengthSym,lengthSym,(this->super_ValueInfo).symStore);
  return &pAVar4->super_ValueInfo;
}

Assistant:

ValueInfo *Copy(
        JitArenaAllocator *const allocator,
        const bool copyHeadSegment = true,
        const bool copyHeadSegmentLength = true,
        const bool copyLength = true) const
    {
        Assert(allocator);

        return
            (copyHeadSegment && headSegmentSym) || (copyHeadSegmentLength && headSegmentLengthSym) || (copyLength && lengthSym)
                ? New(
                    allocator,
                    Type(),
                    copyHeadSegment ? headSegmentSym : nullptr,
                    copyHeadSegmentLength ? headSegmentLengthSym : nullptr,
                    copyLength ? lengthSym : nullptr,
                    GetSymStore())
                : CopyWithGenericStructureKind(allocator);
    }